

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCof.c
# Opt level: O1

int cuddCheckCube(DdManager *dd,DdNode *g)

{
  DdNode *pDVar1;
  DdNode *one;
  DdNode *pDVar2;
  int *piVar3;
  DdNode *pDVar4;
  
  pDVar2 = (DdNode *)((ulong)dd->one ^ 1);
  while( true ) {
    if (dd->one == g) {
      return 1;
    }
    piVar3 = (int *)((ulong)g & 0xfffffffffffffffe);
    if (*piVar3 == 0x7fffffff) break;
    pDVar4 = (DdNode *)((ulong)*(DdNode **)(piVar3 + 6) ^ 1);
    pDVar1 = (DdNode *)((ulong)*(DdNode **)(piVar3 + 4) ^ 1);
    if (((ulong)g & 1) == 0) {
      pDVar4 = *(DdNode **)(piVar3 + 6);
      pDVar1 = *(DdNode **)(piVar3 + 4);
    }
    g = pDVar1;
    if ((pDVar4 != pDVar2) && (g = pDVar4, pDVar1 != pDVar2)) {
      return 0;
    }
  }
  return 0;
}

Assistant:

int
cuddCheckCube(
  DdManager * dd,
  DdNode * g)
{
    DdNode *g1,*g0,*one,*zero;
    
    one = DD_ONE(dd);
    if (g == one) return(1);
    if (Cudd_IsConstant(g)) return(0);

    zero = Cudd_Not(one);
    cuddGetBranches(g,&g1,&g0);

    if (g0 == zero) {
        return(cuddCheckCube(dd, g1));
    }
    if (g1 == zero) {
        return(cuddCheckCube(dd, g0));
    }
    return(0);

}